

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase347::run(TestCase347 *this)

{
  uint uVar1;
  __pid_t _Var2;
  PromiseFulfiller<kj::Promise<int>_> *pPVar3;
  Promise<int> *pPVar4;
  PromiseFulfiller<int> *pPVar5;
  __pid_t local_bc;
  int local_b8;
  bool local_b1;
  undefined4 local_b0;
  bool local_aa;
  bool _kj_shouldLog_2;
  undefined1 local_a8 [6];
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  PromiseFulfillerPair<int> inner;
  PromiseFulfillerPair<kj::Promise<int>_> pair;
  undefined1 local_58 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase347 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  WaitScope::WaitScope((WaitScope *)local_58,(EventLoop *)&waitScope.busyPollInterval);
  newPromiseAndFulfiller<kj::Promise<int>>();
  newPromiseAndFulfiller<int>();
  pPVar3 = Own<kj::PromiseFulfiller<kj::Promise<int>_>_>::operator->
                     ((Own<kj::PromiseFulfiller<kj::Promise<int>_>_> *)
                      &pair.promise.super_PromiseBase.node.ptr);
  uVar1 = (*pPVar3->_vptr_PromiseFulfiller[2])();
  if ((uVar1 & 1) == 0) {
    _kj_shouldLog_2 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_2 != false) {
      _::Debug::log<char_const(&)[45]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x162,ERROR,"\"failed: expected \" \"pair.fulfiller->isWaiting()\"",
                 (char (*) [45])"failed: expected pair.fulfiller->isWaiting()");
      _kj_shouldLog_2 = false;
    }
  }
  pPVar3 = Own<kj::PromiseFulfiller<kj::Promise<int>_>_>::operator->
                     ((Own<kj::PromiseFulfiller<kj::Promise<int>_>_> *)
                      &pair.promise.super_PromiseBase.node.ptr);
  pPVar4 = mv<kj::Promise<int>>((Promise<int> *)local_a8);
  (**pPVar3->_vptr_PromiseFulfiller)(pPVar3,pPVar4);
  pPVar3 = Own<kj::PromiseFulfiller<kj::Promise<int>_>_>::operator->
                     ((Own<kj::PromiseFulfiller<kj::Promise<int>_>_> *)
                      &pair.promise.super_PromiseBase.node.ptr);
  uVar1 = (*pPVar3->_vptr_PromiseFulfiller[2])();
  if ((uVar1 & 1) != 0) {
    local_aa = _::Debug::shouldLog(ERROR);
    while (local_aa != false) {
      _::Debug::log<char_const(&)[48]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x164,ERROR,"\"failed: expected \" \"!(pair.fulfiller->isWaiting())\"",
                 (char (*) [48])"failed: expected !(pair.fulfiller->isWaiting())");
      local_aa = false;
    }
  }
  pPVar5 = Own<kj::PromiseFulfiller<int>_>::operator->
                     ((Own<kj::PromiseFulfiller<int>_> *)&inner.promise.super_PromiseBase.node.ptr);
  local_b0 = 0x7b;
  (**pPVar5->_vptr_PromiseFulfiller)(pPVar5,&local_b0);
  _Var2 = Promise<int>::wait((Promise<int> *)&inner.fulfiller.ptr,local_58);
  if (_Var2 != 0x7b) {
    local_b1 = _::Debug::shouldLog(ERROR);
    while (local_b1 != false) {
      local_b8 = 0x7b;
      local_bc = Promise<int>::wait((Promise<int> *)&inner.fulfiller.ptr,local_58);
      _::Debug::log<char_const(&)[57],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x168,ERROR,
                 "\"failed: expected \" \"(123) == (pair.promise.wait(waitScope))\", 123, pair.promise.wait(waitScope)"
                 ,(char (*) [57])"failed: expected (123) == (pair.promise.wait(waitScope))",
                 &local_b8,&local_bc);
      local_b1 = false;
    }
  }
  PromiseFulfillerPair<int>::~PromiseFulfillerPair((PromiseFulfillerPair<int> *)local_a8);
  PromiseFulfillerPair<kj::Promise<int>_>::~PromiseFulfillerPair
            ((PromiseFulfillerPair<kj::Promise<int>_> *)&inner.fulfiller.ptr);
  WaitScope::~WaitScope((WaitScope *)local_58);
  EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Async, SeparateFulfillerChained) {
  EventLoop loop;
  WaitScope waitScope(loop);

  auto pair = newPromiseAndFulfiller<Promise<int>>();
  auto inner = newPromiseAndFulfiller<int>();

  EXPECT_TRUE(pair.fulfiller->isWaiting());
  pair.fulfiller->fulfill(kj::mv(inner.promise));
  EXPECT_FALSE(pair.fulfiller->isWaiting());

  inner.fulfiller->fulfill(123);

  EXPECT_EQ(123, pair.promise.wait(waitScope));
}